

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

void __thiscall
vkt::QueryPool::anon_unknown_0::TessellationShaderSecondrayInheritedTestInstance::checkExtensions
          (TessellationShaderSecondrayInheritedTestInstance *this)

{
  VkPhysicalDeviceFeatures *pVVar1;
  NotSupportedError *this_00;
  string local_40;
  
  TessellationShaderTestInstance::checkExtensions(&this->super_TessellationShaderTestInstance);
  pVVar1 = Context::getDeviceFeatures
                     ((this->super_TessellationShaderTestInstance).super_GraphicBasicTestInstance.
                      super_StatisticQueryTestInstance.super_TestInstance.m_context);
  if (pVVar1->inheritedQueries != 0) {
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Inherited queries are not supported","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderSecondrayInheritedTestInstance::checkExtensions (void)
{
	TessellationShaderTestInstance::checkExtensions();
	if (!m_context.getDeviceFeatures().inheritedQueries)
		throw tcu::NotSupportedError("Inherited queries are not supported");
}